

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhistory.cc
# Opt level: O1

void __thiscall bdHistory::clearHistory(bdHistory *this)

{
  _Rb_tree_node_base *p_Var1;
  _Self __tmp;
  
  for (p_Var1 = (this->mHistory)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->mHistory)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    std::
    _Rb_tree<long,_std::pair<const_long,_bdMsgHistoryItem>,_std::_Select1st<std::pair<const_long,_bdMsgHistoryItem>_>,_std::less<long>,_std::allocator<std::pair<const_long,_bdMsgHistoryItem>_>_>
    ::clear((_Rb_tree<long,_std::pair<const_long,_bdMsgHistoryItem>,_std::_Select1st<std::pair<const_long,_bdMsgHistoryItem>_>,_std::less<long>,_std::allocator<std::pair<const_long,_bdMsgHistoryItem>_>_>
             *)&p_Var1[2]._M_parent);
  }
  return;
}

Assistant:

void bdHistory::clearHistory() {
	// Switched to a alternative clear, so we don't drop peers, and remember their type.
	//mHistory.clear();
	std::map<bdId, bdMsgHistoryList> ::iterator it;
	for (it = mHistory.begin(); it != mHistory.end(); it++) {
		it->second.clearHistory();
	}
}